

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

optional<spv::Capability>
spvtools::opt::Handler_OpTypePointer_StorageUniformBufferBlock16(Instruction *instruction)

{
  bool bVar1;
  Op OVar2;
  IRContext *pIVar3;
  FeatureManager *feature_manager;
  Capability local_3c;
  DecorationManager *local_38;
  undefined1 local_29;
  anon_class_8_1_8adb1847_for_predicate aStack_28;
  bool matchesCondition;
  DecorationManager *decoration_mgr;
  Instruction *pIStack_18;
  StorageClass storage_class;
  Instruction *instruction_local;
  
  pIStack_18 = instruction;
  OVar2 = Instruction::opcode(instruction);
  if (OVar2 == OpTypePointer) {
    decoration_mgr._4_4_ = Instruction::GetSingleWordInOperand(pIStack_18,0);
    if (decoration_mgr._4_4_ == 2) {
      pIVar3 = Instruction::context(pIStack_18);
      feature_manager = IRContext::get_feature_mgr(pIVar3);
      bVar1 = anon_unknown_10::Has16BitCapability(feature_manager);
      if (bVar1) {
        pIVar3 = Instruction::context(pIStack_18);
        local_38 = IRContext::get_decoration_mgr(pIVar3);
        aStack_28.decoration_mgr = local_38;
        local_29 = (anonymous_namespace)::
                   AnyTypeOf<spvtools::opt::Handler_OpTypePointer_StorageUniformBufferBlock16(spvtools::opt::Instruction_const*)::__0>
                             (pIStack_18,(anon_class_8_1_8adb1847_for_predicate)local_38);
        if ((bool)local_29) {
          local_3c = StorageBuffer16BitAccess;
          std::optional<spv::Capability>::optional<spv::Capability,_true>
                    ((optional<spv::Capability> *)&instruction_local,&local_3c);
        }
        else {
          std::optional<spv::Capability>::optional((optional<spv::Capability> *)&instruction_local);
        }
      }
      else {
        std::optional<spv::Capability>::optional((optional<spv::Capability> *)&instruction_local);
      }
    }
    else {
      std::optional<spv::Capability>::optional((optional<spv::Capability> *)&instruction_local);
    }
    return (_Optional_base<spv::Capability,_true,_true>)
           (_Optional_base<spv::Capability,_true,_true>)instruction_local;
  }
  __assert_fail("instruction->opcode() == spv::Op::OpTypePointer && \"This handler only support OpTypePointer opcodes.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                ,0xd1,
                "std::optional<spv::Capability> spvtools::opt::Handler_OpTypePointer_StorageUniformBufferBlock16(const Instruction *)"
               );
}

Assistant:

static std::optional<spv::Capability>
Handler_OpTypePointer_StorageUniformBufferBlock16(
    const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpTypePointer &&
         "This handler only support OpTypePointer opcodes.");

  // This capability is only required if the variable has a Uniform storage
  // class.
  spv::StorageClass storage_class = spv::StorageClass(
      instruction->GetSingleWordInOperand(kOpTypePointerStorageClassIndex));
  if (storage_class != spv::StorageClass::Uniform) {
    return std::nullopt;
  }

  if (!Has16BitCapability(instruction->context()->get_feature_mgr())) {
    return std::nullopt;
  }

  const auto* decoration_mgr = instruction->context()->get_decoration_mgr();
  const bool matchesCondition =
      AnyTypeOf(instruction, [decoration_mgr](const Instruction* item) {
        if (!decoration_mgr->HasDecoration(item->result_id(),
                                           spv::Decoration::BufferBlock)) {
          return false;
        }

        return AnyTypeOf(item, is16bitType);
      });

  return matchesCondition
             ? std::optional(spv::Capability::StorageUniformBufferBlock16)
             : std::nullopt;
}